

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undefined.cpp
# Opt level: O2

Variable __thiscall
LiteScript::_Type_UNDEFINED::Convert(_Type_UNDEFINED *this,Variable *object,Type *type)

{
  bool bVar1;
  Object *pOVar2;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  Variable VVar4;
  string sStack_68;
  String local_48;
  uint *puVar3;
  
  bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
  if (bVar1) {
    pOVar2 = Variable::operator->((Variable *)type);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    Variable::operator_cast_to_string(&sStack_68,(Variable *)type);
    String::String(&local_48,&sStack_68);
    pOVar2 = Variable::operator->((Variable *)this);
    String::operator=((String *)pOVar2->data,&local_48);
    std::__cxx11::u32string::~u32string((u32string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_68);
    puVar3 = extraout_RDX;
  }
  else {
    bVar1 = Type::operator==(in_RCX,(Type *)_type_boolean);
    pOVar2 = Variable::operator->((Variable *)type);
    if (bVar1) {
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      pOVar2 = Variable::operator->((Variable *)this);
      *(undefined1 *)pOVar2->data = 0;
      puVar3 = extraout_RDX_00;
    }
    else {
      VVar4 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      puVar3 = VVar4.nb_ref;
    }
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_UNDEFINED::Convert(const Variable &object, const Type &type) const {
    if (type == Type::STRING) {
        Variable res = object->memory.Create(Type::STRING);
        res->GetData<String>() = String((std::string)(object));
        return res;
    }
    else if (type == Type::BOOLEAN) {
        Variable v = object->memory.Create(Type::BOOLEAN);
        v->GetData<bool>() = false;
        return v;
    }
    return object->memory.Create(Type::UNDEFINED);
}